

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsRectVisible(ImVec2 *size)

{
  ImVec2 IVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImRect local_10;
  
  IVar1 = (GImGui->CurrentWindow->DC).CursorPos;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = IVar1.x;
  auVar3._4_4_ = IVar1.y;
  auVar4._0_4_ = IVar1.x + (*size).x;
  auVar4._4_4_ = IVar1.y + (*size).y;
  auVar4._8_8_ = 0;
  local_10 = (ImRect)vmovlhps_avx(auVar3,auVar4);
  bVar2 = ImRect::Overlaps(&GImGui->CurrentWindow->ClipRect,&local_10);
  return bVar2;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& size)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(window->DC.CursorPos, window->DC.CursorPos + size));
}